

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise.cpp
# Opt level: O0

int __thiscall
ncnn::DeconvolutionDepthWise::forward
          (DeconvolutionDepthWise *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  float fVar2;
  bool bVar3;
  int iVar4;
  float *pfVar5;
  Mat *pMVar6;
  long in_RSI;
  long in_RDI;
  double dVar7;
  int i_10;
  int size_7;
  float *outptr_9;
  int i_9;
  float max_1;
  float min_1;
  int size_6;
  float *outptr_8;
  int i_8;
  float slope_1;
  int size_5;
  float *outptr_7;
  int i_7;
  int size_4;
  float *outptr_6;
  int k_1;
  float val_1;
  Mat m_1;
  int q;
  float *kptr_1;
  float *outptr_5;
  int j_2;
  int i_6;
  float bias_1;
  float *weight_data_ptr;
  Mat out;
  int p;
  int g_1;
  int num_output_g;
  int channels_g;
  int i_5;
  int size_3;
  float *outptr_4;
  int i_4;
  float max;
  float min;
  int size_2;
  float *outptr_3;
  int i_3;
  float slope;
  int size_1;
  float *outptr_2;
  int i_2;
  int size;
  float *outptr_1;
  float w_1;
  float val;
  int k;
  float *outptr;
  int j_1;
  int i_1;
  float bias;
  Mat m;
  float *kptr;
  float *inptr;
  int g;
  int j;
  int i;
  int gap;
  int p2;
  int p1;
  int *space_ofs;
  vector<int,_std::allocator<int>_> _space_ofs;
  int maxk;
  Mat top_blob_bordered;
  int outh;
  int outw;
  int kernel_extent_h;
  int kernel_extent_w;
  size_t elemsize;
  int channels;
  int h;
  int w;
  undefined4 in_stack_fffffffffffffbb0;
  float in_stack_fffffffffffffbb4;
  Mat *in_stack_fffffffffffffbb8;
  Mat *in_stack_fffffffffffffbc0;
  Option *in_stack_fffffffffffffbc8;
  Mat *in_stack_fffffffffffffbd0;
  undefined4 in_stack_fffffffffffffbd8;
  float in_stack_fffffffffffffbdc;
  DeconvolutionDepthWise *in_stack_fffffffffffffbe0;
  float local_3ec;
  float local_3ac;
  float local_37c;
  int local_340;
  int local_330;
  int local_314;
  float local_2fc;
  int local_2f8;
  int local_2f4;
  float *local_2f0;
  int local_2e8;
  float local_2e4;
  Mat local_2e0;
  int local_294;
  float *local_290;
  float *local_288;
  int local_27c;
  int local_278;
  float local_274;
  float *local_270;
  Mat local_268;
  int local_220;
  int local_21c;
  int local_218;
  int local_214;
  int local_210;
  int local_20c;
  float *local_208;
  int local_200;
  float local_1fc;
  float local_1f8;
  int local_1f4;
  float *local_1f0;
  int local_1e4;
  float local_1e0;
  int local_1dc;
  float *local_1d8;
  float local_1cc;
  int local_1c8;
  int local_1c4;
  float *local_1c0;
  float local_1b4;
  float local_1b0;
  int local_1ac;
  float *local_1a8;
  int local_19c;
  int local_198;
  float local_194;
  Mat local_190;
  float *local_148;
  Mat local_140;
  float *local_f8;
  int local_f0;
  int local_ec;
  int local_e8;
  int local_e4;
  int local_e0;
  int local_dc;
  reference local_d8;
  vector<int,_std::allocator<int>_> local_c8;
  int local_ac;
  undefined4 local_a8;
  Mat local_98;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  undefined8 local_40;
  int local_34;
  int local_30;
  int local_2c;
  int local_4;
  
  local_2c = *(int *)(in_RSI + 0x2c);
  local_30 = *(int *)(in_RSI + 0x30);
  local_34 = *(int *)(in_RSI + 0x38);
  local_40 = *(undefined8 *)(in_RSI + 0x10);
  if ((local_34 % *(int *)(in_RDI + 0x114) == 0) &&
     (*(int *)(in_RDI + 0xd0) % *(int *)(in_RDI + 0x114) == 0)) {
    local_44 = *(int *)(in_RDI + 0xdc) * (*(int *)(in_RDI + 0xd4) + -1) + 1;
    local_48 = *(int *)(in_RDI + 0xe0) * (*(int *)(in_RDI + 0xd8) + -1) + 1;
    local_4c = (local_2c + -1) * *(int *)(in_RDI + 0xe4) + local_44 + *(int *)(in_RDI + 0xfc);
    local_50 = (local_30 + -1) * *(int *)(in_RDI + 0xe8) + local_48 + *(int *)(in_RDI + 0x100);
    ncnn::Mat::Mat(&local_98);
    if (((((*(int *)(in_RDI + 0xec) < 1) && (*(int *)(in_RDI + 0xf0) < 1)) &&
         (*(int *)(in_RDI + 0xf4) < 1)) && (*(int *)(in_RDI + 0xf8) < 1)) &&
       ((*(int *)(in_RDI + 0x104) < 1 || (*(int *)(in_RDI + 0x108) < 1)))) {
      ncnn::Mat::operator=
                (in_stack_fffffffffffffbb8,
                 (Mat *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
      ncnn::Mat::create(in_stack_fffffffffffffbd0,(int)((ulong)in_stack_fffffffffffffbc8 >> 0x20),
                        (int)in_stack_fffffffffffffbc8,
                        (int)((ulong)in_stack_fffffffffffffbc0 >> 0x20),
                        (size_t)in_stack_fffffffffffffbb8,
                        (Allocator *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
    }
    else {
      ncnn::Mat::create(in_stack_fffffffffffffbd0,(int)((ulong)in_stack_fffffffffffffbc8 >> 0x20),
                        (int)in_stack_fffffffffffffbc8,
                        (int)((ulong)in_stack_fffffffffffffbc0 >> 0x20),
                        (size_t)in_stack_fffffffffffffbb8,
                        (Allocator *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
    }
    bVar3 = ncnn::Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
    if (bVar3) {
      local_4 = -100;
      local_a8 = 1;
    }
    else {
      local_ac = *(int *)(in_RDI + 0xd4) * *(int *)(in_RDI + 0xd8);
      std::allocator<int>::allocator((allocator<int> *)0x6b429e);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffbd0,
                 (size_type)in_stack_fffffffffffffbc8,(allocator_type *)in_stack_fffffffffffffbc0);
      std::allocator<int>::~allocator((allocator<int> *)0x6b42ca);
      local_d8 = std::vector<int,_std::allocator<int>_>::operator[](&local_c8,0);
      local_dc = 0;
      local_e0 = 0;
      local_e4 = local_4c * *(int *)(in_RDI + 0xe0) -
                 *(int *)(in_RDI + 0xd4) * *(int *)(in_RDI + 0xdc);
      for (local_e8 = 0; local_e8 < *(int *)(in_RDI + 0xd8); local_e8 = local_e8 + 1) {
        for (local_ec = 0; local_ec < *(int *)(in_RDI + 0xd4); local_ec = local_ec + 1) {
          local_d8[local_dc] = local_e0;
          local_dc = local_dc + 1;
          local_e0 = *(int *)(in_RDI + 0xdc) + local_e0;
        }
        local_e0 = local_e4 + local_e0;
      }
      if ((local_34 == *(int *)(in_RDI + 0x114)) &&
         (*(int *)(in_RDI + 0x114) == *(int *)(in_RDI + 0xd0))) {
        for (local_f0 = 0; local_f0 < *(int *)(in_RDI + 0x114); local_f0 = local_f0 + 1) {
          ncnn::Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),
                             (int)((ulong)in_stack_fffffffffffffbd0 >> 0x20));
          pfVar5 = ncnn::Mat::operator_cast_to_float_(&local_140);
          ncnn::Mat::~Mat((Mat *)0x6b44b9);
          local_f8 = pfVar5;
          local_148 = ncnn::Mat::operator_cast_to_float_((Mat *)(in_RDI + 0x168));
          local_148 = local_148 + local_ac * local_f0;
          ncnn::Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),
                             (int)((ulong)in_stack_fffffffffffffbd0 >> 0x20));
          if (*(int *)(in_RDI + 0x10c) == 0) {
            local_37c = 0.0;
          }
          else {
            pfVar5 = ncnn::Mat::operator[]((Mat *)(in_RDI + 0x1b0),(long)local_f0);
            local_37c = *pfVar5;
          }
          local_194 = local_37c;
          ncnn::Mat::fill(in_stack_fffffffffffffbc0,
                          (float)((ulong)in_stack_fffffffffffffbb8 >> 0x20));
          for (local_198 = 0; local_198 < local_30; local_198 = local_198 + 1) {
            for (local_19c = 0; local_19c < local_2c; local_19c = local_19c + 1) {
              local_1a8 = ncnn::Mat::row(&local_190,local_198 * *(int *)(in_RDI + 0xe8));
              local_1a8 = local_1a8 + local_19c * *(int *)(in_RDI + 0xe4);
              for (local_1ac = 0; local_1ac < local_ac; local_1ac = local_1ac + 1) {
                local_1b0 = local_f8[local_198 * local_2c + local_19c];
                local_1b4 = local_148[local_1ac];
                local_1a8[local_d8[local_1ac]] =
                     local_1b0 * local_1b4 + local_1a8[local_d8[local_1ac]];
              }
            }
          }
          if (*(int *)(in_RDI + 0x118) == 1) {
            local_1c0 = ncnn::Mat::operator_cast_to_float_(&local_190);
            local_1c4 = local_4c * local_50;
            for (local_1c8 = 0; local_1c8 < local_1c4; local_1c8 = local_1c8 + 1) {
              local_1cc = 0.0;
              pfVar5 = std::max<float>(local_1c0 + local_1c8,&local_1cc);
              local_1c0[local_1c8] = *pfVar5;
            }
          }
          else if (*(int *)(in_RDI + 0x118) == 2) {
            local_1d8 = ncnn::Mat::operator_cast_to_float_(&local_190);
            local_1dc = local_4c * local_50;
            pfVar5 = ncnn::Mat::operator[]((Mat *)(in_RDI + 0x120),0);
            local_1e0 = *pfVar5;
            for (local_1e4 = 0; local_1e4 < local_1dc; local_1e4 = local_1e4 + 1) {
              if (local_1d8[local_1e4] <= 0.0) {
                local_3ac = local_1d8[local_1e4] * local_1e0;
              }
              else {
                local_3ac = local_1d8[local_1e4];
              }
              local_1d8[local_1e4] = local_3ac;
            }
          }
          else if (*(int *)(in_RDI + 0x118) == 3) {
            local_1f0 = ncnn::Mat::operator_cast_to_float_(&local_190);
            local_1f4 = local_4c * local_50;
            pfVar5 = ncnn::Mat::operator[]((Mat *)(in_RDI + 0x120),0);
            local_1f8 = *pfVar5;
            pfVar5 = ncnn::Mat::operator[]((Mat *)(in_RDI + 0x120),1);
            local_1fc = *pfVar5;
            for (local_200 = 0; local_200 < local_1f4; local_200 = local_200 + 1) {
              if (local_1f0[local_200] < local_1f8) {
                local_1f0[local_200] = local_1f8;
              }
              if (local_1fc < local_1f0[local_200]) {
                local_1f0[local_200] = local_1fc;
              }
            }
          }
          else if (*(int *)(in_RDI + 0x118) == 4) {
            local_208 = ncnn::Mat::operator_cast_to_float_(&local_190);
            local_20c = local_4c * local_50;
            for (local_210 = 0; local_210 < local_20c; local_210 = local_210 + 1) {
              dVar7 = std::exp((double)((ulong)(uint)local_208[local_210] ^ 0x8000000080000000));
              local_208[local_210] = 1.0 / (SUB84(dVar7,0) + 1.0);
            }
          }
          ncnn::Mat::~Mat((Mat *)0x6b4c3d);
        }
      }
      else {
        local_214 = local_34 / *(int *)(in_RDI + 0x114);
        local_218 = *(int *)(in_RDI + 0xd0) / *(int *)(in_RDI + 0x114);
        for (local_21c = 0; local_21c < *(int *)(in_RDI + 0x114); local_21c = local_21c + 1) {
          for (local_220 = 0; local_220 < local_218; local_220 = local_220 + 1) {
            ncnn::Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),
                               (int)((ulong)in_stack_fffffffffffffbd0 >> 0x20));
            local_270 = ncnn::Mat::operator_cast_to_float_((Mat *)(in_RDI + 0x168));
            local_270 = local_270 + local_ac * local_214 * local_218 * local_21c;
            if (*(int *)(in_RDI + 0x10c) == 0) {
              local_3ec = 0.0;
            }
            else {
              pfVar5 = ncnn::Mat::operator[]
                                 ((Mat *)(in_RDI + 0x1b0),(long)(local_21c * local_218 + local_220))
              ;
              local_3ec = *pfVar5;
            }
            local_274 = local_3ec;
            ncnn::Mat::fill(in_stack_fffffffffffffbc0,
                            (float)((ulong)in_stack_fffffffffffffbb8 >> 0x20));
            for (local_278 = 0; local_278 < local_30; local_278 = local_278 + 1) {
              for (local_27c = 0; local_27c < local_2c; local_27c = local_27c + 1) {
                local_288 = ncnn::Mat::row(&local_268,local_278 * *(int *)(in_RDI + 0xe8));
                local_288 = local_288 + local_27c * *(int *)(in_RDI + 0xe4);
                local_290 = local_270 + local_ac * local_214 * local_220;
                for (local_294 = 0; local_294 < local_214; local_294 = local_294 + 1) {
                  ncnn::Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffbdc,
                                                     in_stack_fffffffffffffbd8),
                                     (int)((ulong)in_stack_fffffffffffffbd0 >> 0x20));
                  pfVar5 = ncnn::Mat::row(&local_2e0,local_278);
                  local_2e4 = pfVar5[local_27c];
                  for (local_2e8 = 0; local_2e8 < local_ac; local_2e8 = local_2e8 + 1) {
                    local_288[local_d8[local_2e8]] =
                         local_2e4 * local_290[local_2e8] + local_288[local_d8[local_2e8]];
                  }
                  local_290 = local_290 + local_ac;
                  ncnn::Mat::~Mat((Mat *)0x6b500d);
                }
              }
            }
            if (*(int *)(in_RDI + 0x118) == 1) {
              local_2f0 = ncnn::Mat::operator_cast_to_float_(&local_268);
              local_2f4 = local_4c * local_50;
              for (local_2f8 = 0; local_2f8 < local_2f4; local_2f8 = local_2f8 + 1) {
                local_2fc = 0.0;
                pfVar5 = std::max<float>(local_2f0 + local_2f8,&local_2fc);
                local_2f0[local_2f8] = *pfVar5;
              }
            }
            else if (*(int *)(in_RDI + 0x118) == 2) {
              pfVar5 = ncnn::Mat::operator_cast_to_float_(&local_268);
              iVar4 = local_4c * local_50;
              in_stack_fffffffffffffbe0 =
                   (DeconvolutionDepthWise *)ncnn::Mat::operator[]((Mat *)(in_RDI + 0x120),0);
              fVar1 = *(float *)&(in_stack_fffffffffffffbe0->super_Layer)._vptr_Layer;
              for (local_314 = 0; local_314 < iVar4; local_314 = local_314 + 1) {
                if (pfVar5[local_314] <= 0.0) {
                  in_stack_fffffffffffffbdc = pfVar5[local_314] * fVar1;
                }
                else {
                  in_stack_fffffffffffffbdc = pfVar5[local_314];
                }
                pfVar5[local_314] = in_stack_fffffffffffffbdc;
              }
            }
            else if (*(int *)(in_RDI + 0x118) == 3) {
              pMVar6 = (Mat *)ncnn::Mat::operator_cast_to_float_(&local_268);
              iVar4 = local_4c * local_50;
              in_stack_fffffffffffffbd0 = pMVar6;
              in_stack_fffffffffffffbc8 = (Option *)ncnn::Mat::operator[]((Mat *)(in_RDI + 0x120),0)
              ;
              fVar1 = *(float *)in_stack_fffffffffffffbc8;
              in_stack_fffffffffffffbc0 = (Mat *)ncnn::Mat::operator[]((Mat *)(in_RDI + 0x120),1);
              fVar2 = *(float *)&in_stack_fffffffffffffbc0->data;
              for (local_330 = 0; local_330 < iVar4; local_330 = local_330 + 1) {
                if (*(float *)((long)&pMVar6->data + (long)local_330 * 4) < fVar1) {
                  *(float *)((long)&pMVar6->data + (long)local_330 * 4) = fVar1;
                }
                if (fVar2 < *(float *)((long)&pMVar6->data + (long)local_330 * 4)) {
                  *(float *)((long)&pMVar6->data + (long)local_330 * 4) = fVar2;
                }
              }
            }
            else if (*(int *)(in_RDI + 0x118) == 4) {
              pMVar6 = (Mat *)ncnn::Mat::operator_cast_to_float_(&local_268);
              iVar4 = local_4c * local_50;
              in_stack_fffffffffffffbb8 = pMVar6;
              for (local_340 = 0; local_340 < iVar4; local_340 = local_340 + 1) {
                dVar7 = std::exp((double)((ulong)(uint)*(float *)((long)&pMVar6->data +
                                                                 (long)local_340 * 4) ^
                                         0x8000000080000000));
                in_stack_fffffffffffffbb4 = SUB84(dVar7,0);
                *(float *)((long)&pMVar6->data + (long)local_340 * 4) =
                     1.0 / (in_stack_fffffffffffffbb4 + 1.0);
              }
            }
            ncnn::Mat::~Mat((Mat *)0x6b54b2);
          }
        }
      }
      cut_padding(in_stack_fffffffffffffbe0,
                  (Mat *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),
                  in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
      bVar3 = ncnn::Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0))
      ;
      if (bVar3) {
        local_4 = -100;
      }
      else {
        local_4 = 0;
      }
      local_a8 = 1;
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffbc0);
    }
    ncnn::Mat::~Mat((Mat *)0x6b5591);
  }
  else {
    local_4 = -100;
  }
  return local_4;
}

Assistant:

int DeconvolutionDepthWise::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // deconvolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    if (channels % group != 0 || num_output % group != 0)
    {
        // reject invalid group
        return -100;
    }

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;
    int outh = (h - 1) * stride_h + kernel_extent_h + output_pad_bottom;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, num_output, elemsize, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = outw * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // depth-wise
    if (channels == group && group == num_output)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            const float* inptr = bottom_blob.channel(g);
            const float* kptr = (const float*)weight_data + maxk * g;
            Mat m = top_blob_bordered.channel(g);

            const float bias = bias_term ? bias_data[g] : 0.f;

            m.fill(bias);

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {
                    float* outptr = m.row(i * stride_h) + j * stride_w;

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = inptr[i * w + j];
                        float w = kptr[k];
                        outptr[space_ofs[k]] += val * w;
                    }
                }
            }

            if (activation_type == 1)
            {
                float* outptr = m;
                int size = outw * outh;

                for (int i = 0; i < size; i++)
                {
                    outptr[i] = std::max(outptr[i], 0.f);
                }
            }
            else if (activation_type == 2)
            {
                float* outptr = m;
                int size = outw * outh;
                float slope = activation_params[0];

                for (int i = 0; i < size; i++)
                {
                    outptr[i] = outptr[i] > 0.f ? outptr[i] : outptr[i] * slope;
                }
            }
            else if (activation_type == 3)
            {
                float* outptr = m;
                int size = outw * outh;
                float min = activation_params[0];
                float max = activation_params[1];

                for (int i = 0; i < size; i++)
                {
                    if (outptr[i] < min)
                        outptr[i] = min;
                    if (outptr[i] > max)
                        outptr[i] = max;
                }
            }
            else if (activation_type == 4)
            {
                float* outptr = m;
                int size = outw * outh;

                for (int i = 0; i < size; i++)
                {
                    outptr[i] = static_cast<float>(1.f / (1.f + exp(-outptr[i])));
                }
            }
        }
    }
    else
    {
        // num_output
        const int channels_g = channels / group;
        const int num_output_g = num_output / group;

#ifdef _WIN32
        #pragma omp parallel for num_threads(opt.num_threads)
#else
        #pragma omp parallel for collapse(2) num_threads(opt.num_threads)
#endif
        for (int g = 0; g < group; g++)
        {
            for (int p = 0; p < num_output_g; p++)
            {
                Mat out = top_blob_bordered.channel(g * num_output_g + p);

                const float* weight_data_ptr = (const float*)weight_data + maxk * channels_g * num_output_g * g;
                const float bias = bias_term ? bias_data[g * num_output_g + p] : 0.f;

                out.fill(bias);

                for (int i = 0; i < h; i++)
                {
                    for (int j = 0; j < w; j++)
                    {
                        float* outptr = out.row(i * stride_h) + j * stride_w;

                        const float* kptr = weight_data_ptr + maxk * channels_g * p;

                        // channels_g
                        for (int q = 0; q < channels_g; q++)
                        {
                            const Mat m = bottom_blob.channel(channels_g * g + q);
                            float val = *(m.row(i) + j);

                            for (int k = 0; k < maxk; k++)
                            {
                                outptr[space_ofs[k]] += val * kptr[k];
                            }

                            kptr += maxk;
                        }
                    }
                }

                if (activation_type == 1)
                {
                    float* outptr = out;
                    int size = outw * outh;

                    for (int i = 0; i < size; i++)
                    {
                        outptr[i] = std::max(outptr[i], 0.f);
                    }
                }
                else if (activation_type == 2)
                {
                    float* outptr = out;
                    int size = outw * outh;
                    float slope = activation_params[0];

                    for (int i = 0; i < size; i++)
                    {
                        outptr[i] = outptr[i] > 0.f ? outptr[i] : outptr[i] * slope;
                    }
                }
                else if (activation_type == 3)
                {
                    float* outptr = out;
                    int size = outw * outh;
                    float min = activation_params[0];
                    float max = activation_params[1];

                    for (int i = 0; i < size; i++)
                    {
                        if (outptr[i] < min)
                            outptr[i] = min;
                        if (outptr[i] > max)
                            outptr[i] = max;
                    }
                }
                else if (activation_type == 4)
                {
                    float* outptr = out;
                    int size = outw * outh;

                    for (int i = 0; i < size; i++)
                    {
                        outptr[i] = static_cast<float>(1.f / (1.f + exp(-outptr[i])));
                    }
                }
            }
        }
    }

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}